

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CodeGenerator::GenerateAll
          (CodeGenerator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  pointer ppFVar1;
  FileDescriptor *pFVar2;
  string *psVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  char cVar6;
  bool bVar7;
  string local_e0;
  AlphaNum local_c0;
  AlphaNum local_90;
  size_type local_60;
  pointer local_58;
  
  uVar5 = 0;
  do {
    ppFVar1 = (files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    bVar7 = (ulong)((long)(files->
                          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <= uVar5
    ;
    if (bVar7) {
      return bVar7;
    }
    pFVar2 = ppFVar1[uVar5];
    iVar4 = (*this->_vptr_CodeGenerator[2])(this,pFVar2,parameter,generator_context,error);
    cVar6 = (char)iVar4;
    if ((error == (string *)0x0) || (cVar6 != '\0')) {
      if (error != (string *)0x0) goto LAB_001374f5;
    }
    else {
      if (error->_M_string_length != 0) goto LAB_00137506;
      std::__cxx11::string::assign((char *)error);
LAB_001374f5:
      if (error->_M_string_length != 0) {
LAB_00137506:
        psVar3 = pFVar2->name_;
        local_58 = (psVar3->_M_dataplus)._M_p;
        local_60 = psVar3->_M_string_length;
        local_90.piece_ = absl::lts_20250127::NullSafeStringView(": ");
        local_c0.piece_._M_str = (error->_M_dataplus)._M_p;
        local_c0.piece_._M_len = error->_M_string_length;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_e0,(lts_20250127 *)&local_60,&local_90,&local_c0,&local_90);
        std::__cxx11::string::operator=((string *)error,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        return (bool)cVar6;
      }
    }
    uVar5 = uVar5 + 1;
    if (cVar6 == '\0') {
      return bVar7;
    }
  } while( true );
}

Assistant:

bool CodeGenerator::GenerateAll(const std::vector<const FileDescriptor*>& files,
                                const std::string& parameter,
                                GeneratorContext* generator_context,
                                std::string* error) const {
  // Default implementation is just to call the per file method, and prefix any
  // error string with the file to provide context.
  bool succeeded = true;
  for (size_t i = 0; i < files.size(); i++) {
    const FileDescriptor* file = files[i];
    succeeded = Generate(file, parameter, generator_context, error);
    if (!succeeded && error && error->empty()) {
      *error =
          "Code generator returned false but provided no error "
          "description.";
    }
    if (error && !error->empty()) {
      *error = absl::StrCat(file->name(), ": ", *error);
      break;
    }
    if (!succeeded) {
      break;
    }
  }
  return succeeded;
}